

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O0

void sf::priv::GlContext::initResource(void)

{
  void *pvVar1;
  ContextSettings *in_stack_00000008;
  GlContext *in_stack_00000010;
  GlxContext *in_stack_00000028;
  GlxContext *in_stack_00000030;
  Lock lock;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Mutex *in_stack_ffffffffffffffb8;
  Lock *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffd7;
  GlContext *in_stack_ffffffffffffffd8;
  
  Lock::Lock(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (((anonymous_namespace)::GlContextImpl::resourceCount == 0) &&
     ((anonymous_namespace)::GlContextImpl::sharedContext == (void *)0x0)) {
    pvVar1 = operator_new(0x58);
    GlxContext::GlxContext(in_stack_00000030,in_stack_00000028);
    (anonymous_namespace)::GlContextImpl::sharedContext = pvVar1;
    in_stack_ffffffffffffffb0 = 0;
    ContextSettings::ContextSettings((ContextSettings *)&stack0xffffffffffffffc8,0,0,0,1,1,0,false);
    initialize(in_stack_00000010,in_stack_00000008);
    anon_unknown.dwarf_3fa667::GlContextImpl::loadExtensions();
    setActive(in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7);
  }
  (anonymous_namespace)::GlContextImpl::resourceCount =
       (anonymous_namespace)::GlContextImpl::resourceCount + 1;
  Lock::~Lock((Lock *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void GlContext::initResource()
{
    using GlContextImpl::mutex;
    using GlContextImpl::resourceCount;
    using GlContextImpl::currentContext;
    using GlContextImpl::sharedContext;
    using GlContextImpl::loadExtensions;

    // Protect from concurrent access
    Lock lock(mutex);

    // If this is the very first resource, trigger the global context initialization
    if (resourceCount == 0)
    {
        if (sharedContext)
        {
            // Increment the resources counter
            resourceCount++;

            return;
        }

        // Create the shared context
        sharedContext = new ContextType(NULL);
        sharedContext->initialize(ContextSettings());

        // Load our extensions vector
        loadExtensions();

        // Deactivate the shared context so that others can activate it when necessary
        sharedContext->setActive(false);
    }

    // Increment the resources counter
    resourceCount++;
}